

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

int __thiscall pbrt::BVHAggregate::flattenBVHTree(BVHAggregate *this,BVHBuildNode *node,int *offset)

{
  LinearBVHNode *pLVar1;
  int iVar2;
  int iVar3;
  LinearBVHNode *pLVar4;
  undefined8 uVar5;
  float fVar6;
  int iVar7;
  int vb;
  int va;
  
  pLVar4 = this->nodes;
  iVar2 = *offset;
  fVar6 = (node->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
  pLVar4[iVar2].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (node->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
  pLVar4[iVar2].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar6;
  fVar6 = (node->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
  uVar5 = *(undefined8 *)&(node->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
  pLVar1 = pLVar4 + iVar2;
  (pLVar1->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       (node->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
  (pLVar1->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar6;
  *(undefined8 *)&(pLVar1->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar5;
  iVar3 = *offset;
  *offset = iVar3 + 1;
  va = node->nPrimitives;
  if (va < 1) {
    pLVar4[iVar2].axis = (uint8_t)node->splitAxis;
    pLVar4[iVar2].nPrimitives = 0;
    flattenBVHTree(this,node->children[0],offset);
    iVar7 = flattenBVHTree(this,node->children[1],offset);
    pLVar4[iVar2].field_1.primitivesOffset = iVar7;
  }
  else {
    if ((node->children[0] != (BVHBuildNode *)0x0) || (node->children[1] != (BVHBuildNode *)0x0)) {
      LogFatal<char_const(&)[41]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x204,"Check failed: %s",(char (*) [41])"!node->children[0] && !node->children[1]"
                );
    }
    vb = 0x10000;
    if (0xffff < va) {
      LogFatal<char_const(&)[18],char_const(&)[6],char_const(&)[18],int&,char_const(&)[6],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x205,"Check failed: %s < %s with %s = %s, %s = %s",
                 (char (*) [18])"node->nPrimitives",(char (*) [6])"65536",
                 (char (*) [18])"node->nPrimitives",&va,(char (*) [6])"65536",&vb);
    }
    pLVar4[iVar2].field_1 = (anon_union_4_2_72e6e63f_for_LinearBVHNode_1)node->firstPrimOffset;
    pLVar4[iVar2].nPrimitives = (uint16_t)node->nPrimitives;
  }
  return iVar3;
}

Assistant:

int BVHAggregate::flattenBVHTree(BVHBuildNode *node, int *offset) {
    LinearBVHNode *linearNode = &nodes[*offset];
    linearNode->bounds = node->bounds;
    int nodeOffset = (*offset)++;
    if (node->nPrimitives > 0) {
        CHECK(!node->children[0] && !node->children[1]);
        CHECK_LT(node->nPrimitives, 65536);
        linearNode->primitivesOffset = node->firstPrimOffset;
        linearNode->nPrimitives = node->nPrimitives;
    } else {
        // Create interior flattened BVH node
        linearNode->axis = node->splitAxis;
        linearNode->nPrimitives = 0;
        flattenBVHTree(node->children[0], offset);
        linearNode->secondChildOffset = flattenBVHTree(node->children[1], offset);
    }
    return nodeOffset;
}